

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

Gia_Man_t * Gia_ManFromBridge(FILE *pFile,Vec_Int_t **pvInit)

{
  uchar *__ptr;
  int iVar1;
  Gia_Man_t *pGVar2;
  int Size;
  uchar *pBuffer;
  int Type;
  int local_34;
  uchar *local_30;
  int local_24;
  
  iVar1 = Gia_ManFromBridgeReadPackage(pFile,&local_24,&local_34,&local_30);
  if (local_30 != (uchar *)0x0) {
    free(local_30);
    local_30 = (uchar *)0x0;
  }
  if ((iVar1 != 0) &&
     (iVar1 = Gia_ManFromBridgeReadPackage(pFile,&local_24,&local_34,&local_30), __ptr = local_30,
     iVar1 != 0)) {
    pGVar2 = Gia_ManFromBridgeReadBody(local_34,local_30,pvInit);
    if (__ptr != (uchar *)0x0) {
      free(__ptr);
      local_30 = (uchar *)0x0;
    }
    if (pGVar2 != (Gia_Man_t *)0x0) {
      iVar1 = Gia_ManFromBridgeReadPackage(pFile,&local_24,&local_34,&local_30);
      free(local_30);
      if (iVar1 != 0) {
        return pGVar2;
      }
      return (Gia_Man_t *)0x0;
    }
  }
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManFromBridge( FILE * pFile, Vec_Int_t ** pvInit )
{
    unsigned char * pBuffer;
    int Type, Size, RetValue;
    Gia_Man_t * p = NULL;

    RetValue = Gia_ManFromBridgeReadPackage( pFile, &Type, &Size, &pBuffer );
    ABC_FREE( pBuffer );
    if ( !RetValue )
        return NULL;

    RetValue = Gia_ManFromBridgeReadPackage( pFile, &Type, &Size, &pBuffer );
    if ( !RetValue )
        return NULL;

    p = Gia_ManFromBridgeReadBody( Size, pBuffer, pvInit );
    ABC_FREE( pBuffer );
    if ( p == NULL )
        return NULL;

    RetValue = Gia_ManFromBridgeReadPackage( pFile, &Type, &Size, &pBuffer );
    ABC_FREE( pBuffer );
    if ( !RetValue )
        return NULL;

    return p;
}